

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O0

void __thiscall Fl_Scroll_Type::copy_properties(Fl_Scroll_Type *this)

{
  Fl_Scroll *this_00;
  Fl_Widget *this_01;
  uchar t;
  int X;
  int Y;
  Fl_Align FVar1;
  Fl_Scroll *d;
  Fl_Scroll *s;
  Fl_Scroll_Type *this_local;
  
  Fl_Group_Type::copy_properties(&this->super_Fl_Group_Type);
  this_00 = (Fl_Scroll *)(this->super_Fl_Group_Type).super_Fl_Widget_Type.o;
  this_01 = (this->super_Fl_Group_Type).super_Fl_Widget_Type.live_widget;
  X = Fl_Scroll::xposition(this_00);
  Y = Fl_Scroll::yposition(this_00);
  Fl_Widget::position(this_01,X,Y);
  t = Fl_Widget::type((Fl_Widget *)this_00);
  Fl_Widget::type(this_01,t);
  FVar1 = Fl_Widget::align((Fl_Widget *)&this_00->scrollbar);
  Fl_Widget::align((Fl_Widget *)&this_01[1].label_.deimage,FVar1);
  FVar1 = Fl_Widget::align((Fl_Widget *)&this_00->hscrollbar);
  Fl_Widget::align((Fl_Widget *)&this_01[3].parent_,FVar1);
  return;
}

Assistant:

void Fl_Scroll_Type::copy_properties() {
  Fl_Group_Type::copy_properties();
  Fl_Scroll *s = (Fl_Scroll*)o, *d = (Fl_Scroll*)live_widget;
  d->position(s->xposition(), s->yposition());
  d->type(s->type()); // TODO: get this flag from Fl_Scroll_Type!
  d->scrollbar.align(s->scrollbar.align());
  d->hscrollbar.align(s->hscrollbar.align());
}